

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.h
# Opt level: O0

void load_GL_EXT_vertex_shader(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_vertex_shader != 0) {
    glad_glBeginVertexShaderEXT = (PFNGLBEGINVERTEXSHADEREXTPROC)(*load)("glBeginVertexShaderEXT");
    glad_glEndVertexShaderEXT = (PFNGLENDVERTEXSHADEREXTPROC)(*load)("glEndVertexShaderEXT");
    glad_glBindVertexShaderEXT = (PFNGLBINDVERTEXSHADEREXTPROC)(*load)("glBindVertexShaderEXT");
    glad_glGenVertexShadersEXT = (PFNGLGENVERTEXSHADERSEXTPROC)(*load)("glGenVertexShadersEXT");
    glad_glDeleteVertexShaderEXT =
         (PFNGLDELETEVERTEXSHADEREXTPROC)(*load)("glDeleteVertexShaderEXT");
    glad_glShaderOp1EXT = (PFNGLSHADEROP1EXTPROC)(*load)("glShaderOp1EXT");
    glad_glShaderOp2EXT = (PFNGLSHADEROP2EXTPROC)(*load)("glShaderOp2EXT");
    glad_glShaderOp3EXT = (PFNGLSHADEROP3EXTPROC)(*load)("glShaderOp3EXT");
    glad_glSwizzleEXT = (PFNGLSWIZZLEEXTPROC)(*load)("glSwizzleEXT");
    glad_glWriteMaskEXT = (PFNGLWRITEMASKEXTPROC)(*load)("glWriteMaskEXT");
    glad_glInsertComponentEXT = (PFNGLINSERTCOMPONENTEXTPROC)(*load)("glInsertComponentEXT");
    glad_glExtractComponentEXT = (PFNGLEXTRACTCOMPONENTEXTPROC)(*load)("glExtractComponentEXT");
    glad_glGenSymbolsEXT = (PFNGLGENSYMBOLSEXTPROC)(*load)("glGenSymbolsEXT");
    glad_glSetInvariantEXT = (PFNGLSETINVARIANTEXTPROC)(*load)("glSetInvariantEXT");
    glad_glSetLocalConstantEXT = (PFNGLSETLOCALCONSTANTEXTPROC)(*load)("glSetLocalConstantEXT");
    glad_glVariantbvEXT = (PFNGLVARIANTBVEXTPROC)(*load)("glVariantbvEXT");
    glad_glVariantsvEXT = (PFNGLVARIANTSVEXTPROC)(*load)("glVariantsvEXT");
    glad_glVariantivEXT = (PFNGLVARIANTIVEXTPROC)(*load)("glVariantivEXT");
    glad_glVariantfvEXT = (PFNGLVARIANTFVEXTPROC)(*load)("glVariantfvEXT");
    glad_glVariantdvEXT = (PFNGLVARIANTDVEXTPROC)(*load)("glVariantdvEXT");
    glad_glVariantubvEXT = (PFNGLVARIANTUBVEXTPROC)(*load)("glVariantubvEXT");
    glad_glVariantusvEXT = (PFNGLVARIANTUSVEXTPROC)(*load)("glVariantusvEXT");
    glad_glVariantuivEXT = (PFNGLVARIANTUIVEXTPROC)(*load)("glVariantuivEXT");
    glad_glVariantPointerEXT = (PFNGLVARIANTPOINTEREXTPROC)(*load)("glVariantPointerEXT");
    glad_glEnableVariantClientStateEXT =
         (PFNGLENABLEVARIANTCLIENTSTATEEXTPROC)(*load)("glEnableVariantClientStateEXT");
    glad_glDisableVariantClientStateEXT =
         (PFNGLDISABLEVARIANTCLIENTSTATEEXTPROC)(*load)("glDisableVariantClientStateEXT");
    glad_glBindLightParameterEXT =
         (PFNGLBINDLIGHTPARAMETEREXTPROC)(*load)("glBindLightParameterEXT");
    glad_glBindMaterialParameterEXT =
         (PFNGLBINDMATERIALPARAMETEREXTPROC)(*load)("glBindMaterialParameterEXT");
    glad_glBindTexGenParameterEXT =
         (PFNGLBINDTEXGENPARAMETEREXTPROC)(*load)("glBindTexGenParameterEXT");
    glad_glBindTextureUnitParameterEXT =
         (PFNGLBINDTEXTUREUNITPARAMETEREXTPROC)(*load)("glBindTextureUnitParameterEXT");
    glad_glBindParameterEXT = (PFNGLBINDPARAMETEREXTPROC)(*load)("glBindParameterEXT");
    glad_glIsVariantEnabledEXT = (PFNGLISVARIANTENABLEDEXTPROC)(*load)("glIsVariantEnabledEXT");
    glad_glGetVariantBooleanvEXT =
         (PFNGLGETVARIANTBOOLEANVEXTPROC)(*load)("glGetVariantBooleanvEXT");
    glad_glGetVariantIntegervEXT =
         (PFNGLGETVARIANTINTEGERVEXTPROC)(*load)("glGetVariantIntegervEXT");
    glad_glGetVariantFloatvEXT = (PFNGLGETVARIANTFLOATVEXTPROC)(*load)("glGetVariantFloatvEXT");
    glad_glGetVariantPointervEXT =
         (PFNGLGETVARIANTPOINTERVEXTPROC)(*load)("glGetVariantPointervEXT");
    glad_glGetInvariantBooleanvEXT =
         (PFNGLGETINVARIANTBOOLEANVEXTPROC)(*load)("glGetInvariantBooleanvEXT");
    glad_glGetInvariantIntegervEXT =
         (PFNGLGETINVARIANTINTEGERVEXTPROC)(*load)("glGetInvariantIntegervEXT");
    glad_glGetInvariantFloatvEXT =
         (PFNGLGETINVARIANTFLOATVEXTPROC)(*load)("glGetInvariantFloatvEXT");
    glad_glGetLocalConstantBooleanvEXT =
         (PFNGLGETLOCALCONSTANTBOOLEANVEXTPROC)(*load)("glGetLocalConstantBooleanvEXT");
    glad_glGetLocalConstantIntegervEXT =
         (PFNGLGETLOCALCONSTANTINTEGERVEXTPROC)(*load)("glGetLocalConstantIntegervEXT");
    glad_glGetLocalConstantFloatvEXT =
         (PFNGLGETLOCALCONSTANTFLOATVEXTPROC)(*load)("glGetLocalConstantFloatvEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_vertex_shader(GLADloadproc load) {
	if(!GLAD_GL_EXT_vertex_shader) return;
	glad_glBeginVertexShaderEXT = (PFNGLBEGINVERTEXSHADEREXTPROC)load("glBeginVertexShaderEXT");
	glad_glEndVertexShaderEXT = (PFNGLENDVERTEXSHADEREXTPROC)load("glEndVertexShaderEXT");
	glad_glBindVertexShaderEXT = (PFNGLBINDVERTEXSHADEREXTPROC)load("glBindVertexShaderEXT");
	glad_glGenVertexShadersEXT = (PFNGLGENVERTEXSHADERSEXTPROC)load("glGenVertexShadersEXT");
	glad_glDeleteVertexShaderEXT = (PFNGLDELETEVERTEXSHADEREXTPROC)load("glDeleteVertexShaderEXT");
	glad_glShaderOp1EXT = (PFNGLSHADEROP1EXTPROC)load("glShaderOp1EXT");
	glad_glShaderOp2EXT = (PFNGLSHADEROP2EXTPROC)load("glShaderOp2EXT");
	glad_glShaderOp3EXT = (PFNGLSHADEROP3EXTPROC)load("glShaderOp3EXT");
	glad_glSwizzleEXT = (PFNGLSWIZZLEEXTPROC)load("glSwizzleEXT");
	glad_glWriteMaskEXT = (PFNGLWRITEMASKEXTPROC)load("glWriteMaskEXT");
	glad_glInsertComponentEXT = (PFNGLINSERTCOMPONENTEXTPROC)load("glInsertComponentEXT");
	glad_glExtractComponentEXT = (PFNGLEXTRACTCOMPONENTEXTPROC)load("glExtractComponentEXT");
	glad_glGenSymbolsEXT = (PFNGLGENSYMBOLSEXTPROC)load("glGenSymbolsEXT");
	glad_glSetInvariantEXT = (PFNGLSETINVARIANTEXTPROC)load("glSetInvariantEXT");
	glad_glSetLocalConstantEXT = (PFNGLSETLOCALCONSTANTEXTPROC)load("glSetLocalConstantEXT");
	glad_glVariantbvEXT = (PFNGLVARIANTBVEXTPROC)load("glVariantbvEXT");
	glad_glVariantsvEXT = (PFNGLVARIANTSVEXTPROC)load("glVariantsvEXT");
	glad_glVariantivEXT = (PFNGLVARIANTIVEXTPROC)load("glVariantivEXT");
	glad_glVariantfvEXT = (PFNGLVARIANTFVEXTPROC)load("glVariantfvEXT");
	glad_glVariantdvEXT = (PFNGLVARIANTDVEXTPROC)load("glVariantdvEXT");
	glad_glVariantubvEXT = (PFNGLVARIANTUBVEXTPROC)load("glVariantubvEXT");
	glad_glVariantusvEXT = (PFNGLVARIANTUSVEXTPROC)load("glVariantusvEXT");
	glad_glVariantuivEXT = (PFNGLVARIANTUIVEXTPROC)load("glVariantuivEXT");
	glad_glVariantPointerEXT = (PFNGLVARIANTPOINTEREXTPROC)load("glVariantPointerEXT");
	glad_glEnableVariantClientStateEXT = (PFNGLENABLEVARIANTCLIENTSTATEEXTPROC)load("glEnableVariantClientStateEXT");
	glad_glDisableVariantClientStateEXT = (PFNGLDISABLEVARIANTCLIENTSTATEEXTPROC)load("glDisableVariantClientStateEXT");
	glad_glBindLightParameterEXT = (PFNGLBINDLIGHTPARAMETEREXTPROC)load("glBindLightParameterEXT");
	glad_glBindMaterialParameterEXT = (PFNGLBINDMATERIALPARAMETEREXTPROC)load("glBindMaterialParameterEXT");
	glad_glBindTexGenParameterEXT = (PFNGLBINDTEXGENPARAMETEREXTPROC)load("glBindTexGenParameterEXT");
	glad_glBindTextureUnitParameterEXT = (PFNGLBINDTEXTUREUNITPARAMETEREXTPROC)load("glBindTextureUnitParameterEXT");
	glad_glBindParameterEXT = (PFNGLBINDPARAMETEREXTPROC)load("glBindParameterEXT");
	glad_glIsVariantEnabledEXT = (PFNGLISVARIANTENABLEDEXTPROC)load("glIsVariantEnabledEXT");
	glad_glGetVariantBooleanvEXT = (PFNGLGETVARIANTBOOLEANVEXTPROC)load("glGetVariantBooleanvEXT");
	glad_glGetVariantIntegervEXT = (PFNGLGETVARIANTINTEGERVEXTPROC)load("glGetVariantIntegervEXT");
	glad_glGetVariantFloatvEXT = (PFNGLGETVARIANTFLOATVEXTPROC)load("glGetVariantFloatvEXT");
	glad_glGetVariantPointervEXT = (PFNGLGETVARIANTPOINTERVEXTPROC)load("glGetVariantPointervEXT");
	glad_glGetInvariantBooleanvEXT = (PFNGLGETINVARIANTBOOLEANVEXTPROC)load("glGetInvariantBooleanvEXT");
	glad_glGetInvariantIntegervEXT = (PFNGLGETINVARIANTINTEGERVEXTPROC)load("glGetInvariantIntegervEXT");
	glad_glGetInvariantFloatvEXT = (PFNGLGETINVARIANTFLOATVEXTPROC)load("glGetInvariantFloatvEXT");
	glad_glGetLocalConstantBooleanvEXT = (PFNGLGETLOCALCONSTANTBOOLEANVEXTPROC)load("glGetLocalConstantBooleanvEXT");
	glad_glGetLocalConstantIntegervEXT = (PFNGLGETLOCALCONSTANTINTEGERVEXTPROC)load("glGetLocalConstantIntegervEXT");
	glad_glGetLocalConstantFloatvEXT = (PFNGLGETLOCALCONSTANTFLOATVEXTPROC)load("glGetLocalConstantFloatvEXT");
}